

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompression.cpp
# Opt level: O3

void testCompression(string *tempDir)

{
  int iVar1;
  ushort *puVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  double __x;
  double __x_00;
  double dVar6;
  double dVar7;
  undefined3 uVar8;
  char cVar9;
  ushort uVar10;
  uint16_t uVar11;
  undefined2 uVar12;
  byte bVar13;
  int y;
  uint uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  int y_3;
  int x_3;
  int y_1;
  int x;
  long lVar18;
  half *phVar19;
  long lVar20;
  float *pfVar21;
  int x_1;
  ulong uVar22;
  int y_2;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  int x_2;
  ulong uVar26;
  float fVar27;
  pixelArray array;
  undefined8 uStack_e0;
  pixelArray local_d8;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing pixel data types, subsampling and compression schemes",
             0x3d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  anon_unknown.dwarf_b160b::pixelArray::pixelArray(&local_d8,0x9f,0x55b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"only zeroes",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  lVar16 = 0;
  do {
    lVar18 = 0;
    do {
      local_d8.i._data[lVar16 * local_d8.i._sizeY + lVar18] = 0;
      local_d8.h._data[lVar16 * local_d8.h._sizeY + lVar18]._h = 0;
      local_d8.f._data[lVar16 * local_d8.f._sizeY + lVar18] = 0.0;
      lVar20 = 0x58;
      do {
        *(undefined2 *)
         (*(long *)((long)&uStack_e0 + lVar20) * lVar16 * 2 +
          *(long *)((long)&(((pixelArray *)(local_d8.rgba + -3))->i)._sizeX + lVar20) + lVar18 * 2)
             = 0;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0xb8);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x55b);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x9f);
  anon_unknown.dwarf_b160b::writeRead
            ((string *)(tempDir->_M_dataplus)._M_p,(pixelArray *)tempDir->_M_string_length,
             (int)&local_d8,0x9f,0x55b,0xb8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pattern 1",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  lVar16 = 0;
  do {
    phVar19 = local_d8.h._data + lVar16 * local_d8.h._sizeY;
    pfVar21 = local_d8.f._data + lVar16 * local_d8.f._sizeY;
    lVar18 = 0;
    do {
      uVar14 = (int)lVar18 + (int)lVar16 & 1;
      fVar27 = (float)uVar14;
      local_d8.i._data[lVar16 * local_d8.i._sizeY + lVar18] = uVar14;
      if ((uint)fVar27 < 0x38800000) {
        if ((uint)fVar27 < 0x33000001) {
          uVar10 = 0;
        }
        else {
          uVar14 = (uint)fVar27 & 0x7fffff | 0x800000;
          cVar9 = (char)((uint)fVar27 >> 0x17);
          uVar10 = (ushort)(uVar14 >> (0x7eU - cVar9 & 0x1f));
          if (0x80000000 < uVar14 << (cVar9 + 0xa2U & 0x1f)) {
            uVar10 = uVar10 + 1;
          }
        }
      }
      else if ((uint)fVar27 < 0x7f800000) {
        if ((uint)fVar27 < 0x477ff000) {
          uVar10 = (ushort)((int)fVar27 + 0x8000fff + (uint)(((uint)fVar27 >> 0xd & 1) != 0) >> 0xd)
          ;
        }
        else {
          uVar10 = 0x7c00;
        }
      }
      else {
        uVar10 = 0x7c00;
        if (fVar27 != INFINITY) {
          uVar14 = (uint)fVar27 >> 0xd & 0x3ff;
          uVar10 = (ushort)(uVar14 == 0) | (ushort)uVar14 | 0x7c00;
        }
      }
      uVar14 = (uint)fVar27 & 0x7fffff | 0x800000;
      cVar9 = (char)((uint)fVar27 >> 0x17);
      uVar24 = (uint)fVar27 >> 0xd & 0x3ff;
      uVar15 = (uint)(0x80000000 < uVar14 << (cVar9 + 0xa2U & 0x1f)) +
               (uVar14 >> (0x7eU - cVar9 & 0x1f));
      uVar14 = (int)fVar27 + 0x8000fff + (uint)(((uint)fVar27 >> 0xd & 1) != 0) >> 0xd;
      if (0x477fefff < (uint)fVar27) {
        uVar14 = 0x7c00;
      }
      uVar24 = uVar24 | 0x7c00 | (uint)(uVar24 == 0);
      if (fVar27 == INFINITY) {
        uVar24 = 0x7c00;
      }
      if ((uint)fVar27 < 0x7f800000) {
        uVar24 = uVar14;
      }
      if ((uint)fVar27 < 0x33000001) {
        uVar15 = 0;
      }
      phVar19[lVar18]._h = uVar10;
      pfVar21[lVar18] = fVar27;
      if (0x387fffff < (uint)fVar27) {
        uVar15 = uVar24;
      }
      lVar20 = 0x58;
      do {
        *(short *)(*(long *)((long)&uStack_e0 + lVar20) * lVar16 * 2 +
                   *(long *)((long)&(((pixelArray *)(local_d8.rgba + -3))->i)._sizeX + lVar20) +
                  lVar18 * 2) = (short)uVar15;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0xb8);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x55b);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x9f);
  anon_unknown.dwarf_b160b::writeRead
            ((string *)(tempDir->_M_dataplus)._M_p,(pixelArray *)tempDir->_M_string_length,
             (int)&local_d8,uVar15,(int)phVar19,(int)pfVar21);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pattern 2",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  uVar23 = 0;
  do {
    __x = (double)(int)uVar23;
    __x_00 = __x * 0.5;
    uVar26 = 0;
    do {
      uVar15 = (uint)uVar26;
      uVar22 = uVar26 & 0xffffffff;
      uVar14 = (uVar15 + ((uVar15 & 0xffff) / 100) * -100 & 0xffff) +
               ((int)uVar23 + (int)((uVar23 & 0xffffffff) / 100) * -100) * 100;
      uVar17 = (ulong)uVar14;
      local_d8.i._data[uVar23 * local_d8.i._sizeY + uVar26] = uVar14;
      dVar6 = sin((double)(int)uVar15);
      dVar7 = sin(__x_00);
      fVar27 = ABS((float)(dVar7 + dVar6));
      uVar10 = (ushort)((uint)(float)(dVar7 + dVar6) >> 0x10) & 0x8000;
      if ((uint)fVar27 < 0x38800000) {
        if (0x33000000 < (uint)fVar27) {
          uVar14 = (uint)fVar27 & 0x7fffff | 0x800000;
          iVar1 = ((uint)fVar27 >> 0x17) - 0x5e;
          uVar8 = (undefined3)((uint)iVar1 >> 8);
          bVar13 = 0x7e - (char)((uint)fVar27 >> 0x17);
          uVar17 = (ulong)CONCAT31(uVar8,bVar13);
          uVar10 = uVar10 | (ushort)(uVar14 >> (bVar13 & 0x1f));
          if (uVar14 << ((byte)iVar1 & 0x1f) < 0x80000001) {
            uVar17 = (ulong)CONCAT31(uVar8,1);
          }
          else {
            uVar10 = uVar10 + 1;
          }
        }
      }
      else if ((uint)fVar27 < 0x7f800000) {
        if ((uint)fVar27 < 0x477ff000) {
          uVar10 = (ushort)((int)fVar27 + 0x8000fff + (uint)(((uint)fVar27 >> 0xd & 1) != 0) >> 0xd)
                   | uVar10;
        }
        else {
          uVar10 = uVar10 | 0x7c00;
        }
      }
      else {
        uVar10 = uVar10 | 0x7c00;
        if (fVar27 != INFINITY) {
          uVar14 = (uint)fVar27 >> 0xd & 0x3ff;
          uVar17 = (ulong)(uVar14 == 0);
          uVar10 = uVar10 | (ushort)uVar14 | (ushort)(uVar14 == 0);
        }
      }
      local_d8.h._data[uVar23 * local_d8.h._sizeY + uVar26]._h = uVar10;
      dVar6 = sin(__x);
      dVar7 = sin((double)(int)uVar15 * 0.5);
      local_d8.f._data[uVar23 * local_d8.f._sizeY + uVar26] = (float)(dVar7 + dVar6);
      lVar16 = 0x58;
      do {
        dVar6 = sin((double)(int)uVar22);
        dVar7 = sin(__x_00);
        fVar27 = ABS((float)(dVar7 + dVar6));
        uVar10 = (ushort)((uint)(float)(dVar7 + dVar6) >> 0x10) & 0x8000;
        if ((uint)fVar27 < 0x38800000) {
          if (0x33000000 < (uint)fVar27) {
            uVar15 = (uint)fVar27 >> 0x17;
            phVar19 = (half *)(ulong)uVar15;
            uVar14 = (uint)fVar27 & 0x7fffff | 0x800000;
            uVar8 = (undefined3)(uVar15 - 0x5e >> 8);
            bVar13 = 0x7e - (char)uVar15;
            uVar17 = (ulong)CONCAT31(uVar8,bVar13);
            uVar10 = uVar10 | (ushort)(uVar14 >> (bVar13 & 0x1f));
            if (uVar14 << ((byte)(uVar15 - 0x5e) & 0x1f) < 0x80000001) {
              uVar17 = (ulong)CONCAT31(uVar8,1);
            }
            else {
              uVar10 = uVar10 + 1;
            }
          }
        }
        else if ((uint)fVar27 < 0x7f800000) {
          if ((uint)fVar27 < 0x477ff000) {
            uVar10 = (ushort)((int)fVar27 + 0x8000fff + (uint)(((uint)fVar27 >> 0xd & 1) != 0) >>
                             0xd) | uVar10;
          }
          else {
            uVar10 = uVar10 | 0x7c00;
          }
        }
        else {
          uVar10 = uVar10 | 0x7c00;
          if (fVar27 != INFINITY) {
            uVar14 = (uint)fVar27 >> 0xd & 0x3ff;
            uVar17 = (ulong)(uVar14 == 0);
            uVar10 = uVar10 | (ushort)uVar14 | (ushort)(uVar14 == 0);
          }
        }
        *(ushort *)
         (*(long *)((long)&uStack_e0 + lVar16) * uVar23 * 2 +
          *(long *)((long)&(((pixelArray *)(local_d8.rgba + -3))->i)._sizeX + lVar16) + uVar26 * 2)
             = uVar10;
        lVar16 = lVar16 + 0x18;
        uVar22 = (ulong)((int)uVar22 + 1);
      } while (lVar16 != 0xb8);
      uVar26 = uVar26 + 1;
    } while (uVar26 != 0x55b);
    uVar23 = uVar23 + 1;
  } while (uVar23 != 0x9f);
  anon_unknown.dwarf_b160b::writeRead
            ((string *)(tempDir->_M_dataplus)._M_p,(pixelArray *)tempDir->_M_string_length,
             (int)&local_d8,(int)uVar17,(int)phVar19,(int)pfVar21);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"random bits",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  puVar2 = (ushort *)((long)&uStack_e0 + 2);
  uStack_e0._2_4_ = 0x5a5a5a5a;
  uStack_e0._6_2_ = 0x5a5a;
  lVar16 = 0;
  do {
    lVar18 = lVar16 * local_d8.f._sizeY;
    lVar20 = 0;
    do {
      uVar14 = Imath_3_2::nrand48(puVar2);
      local_d8.i._data[lVar16 * local_d8.i._sizeY + lVar20] = uVar14;
      uVar11 = Imath_3_2::nrand48(puVar2);
      local_d8.h._data[lVar16 * local_d8.h._sizeY + lVar20]._h = uVar11;
      lVar25 = 0x58;
      do {
        lVar3 = *(long *)((long)&uStack_e0 + lVar25);
        lVar4 = *(long *)((long)&(((pixelArray *)(local_d8.rgba + -3))->i)._sizeX + lVar25);
        uVar12 = Imath_3_2::nrand48(puVar2);
        *(undefined2 *)(lVar4 + lVar3 * lVar16 * 2 + lVar20 * 2) = uVar12;
        lVar25 = lVar25 + 0x18;
      } while (lVar25 != 0xb8);
      fVar27 = (float)Imath_3_2::nrand48(puVar2);
      (local_d8.f._data + lVar18)[lVar20] = fVar27;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x55b);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x9f);
  anon_unknown.dwarf_b160b::writeRead
            ((string *)(tempDir->_M_dataplus)._M_p,(pixelArray *)tempDir->_M_string_length,
             (int)&local_d8,(int)(local_d8.f._data + lVar18),(int)phVar19,(int)pfVar21);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  lVar16 = 0xa0;
  do {
    pvVar5 = *(void **)((long)&(((pixelArray *)(local_d8.rgba + -3))->i)._sizeX + lVar16);
    if (pvVar5 != (void *)0x0) {
      operator_delete__(pvVar5);
    }
    lVar16 = lVar16 + -0x18;
  } while (lVar16 != 0x40);
  if (local_d8.h._data != (half *)0x0) {
    operator_delete__(local_d8.h._data);
  }
  if (local_d8.f._data != (float *)0x0) {
    operator_delete__(local_d8.f._data);
  }
  if (local_d8.i._data != (uint *)0x0) {
    operator_delete__(local_d8.i._data);
  }
  return;
}

Assistant:

void
testCompression (const std::string& tempDir)
{
    try
    {
        cout << "Testing pixel data types, "
                "subsampling and "
                "compression schemes"
             << endl;

        const int W  = 1371;
        const int H  = 159;
        const int DX = 17;
        const int DY = 29;

        pixelArray array (H, W);

        //
        // If the following assertion fails, new pixel types have
        // been added to the Imf library; testing code for the new
        // pixel types should be added to this file.
        //

        assert (NUM_PIXELTYPES == 3);

        fillPixels1 (array, W, H);
        writeRead (tempDir, array, W, H, DX, DY);

        fillPixels2 (array, W, H);
        writeRead (tempDir, array, W, H, DX, DY);

        fillPixels3 (array, W, H);
        writeRead (tempDir, array, W, H, DX, DY);

        fillPixels4 (array, W, H);
        writeRead (tempDir, array, W, H, DX, DY);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}